

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

UInt __thiscall Json::Value::asUInt(Value *this)

{
  double dVar1;
  byte bVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  Value local_180 [2];
  ios_base local_110 [264];
  
  bVar2 = this->field_0x8;
  switch(bVar2) {
  case 1:
    bVar3 = isUInt(this);
    if (bVar3) {
LAB_00124d94:
      return *(UInt *)&this->value_;
    }
    this = local_180;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"LargestInt out of UInt range",0x1c);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    bVar2 = (this->value_).bool_;
  case 0:
    return (uint)bVar2;
  case 2:
    bVar3 = isUInt(this);
    if (bVar3) goto LAB_00124d94;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"LargestUInt out of UInt range",0x1d);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((0.0 <= dVar1) && (dVar1 <= 4294967295.0)) {
      return (UInt)(long)dVar1;
    }
    break;
  default:
    goto switchD_00124d3b_caseD_4;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"double out of UInt range",0x18);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
switchD_00124d3b_caseD_4:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"Value is not convertible to UInt.",0x21);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_180);
  std::ios_base::~ios_base(local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Value::UInt Value::asUInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestInt out of UInt range");
    return UInt(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestUInt out of UInt range");
    return UInt(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt),
                        "double out of UInt range");
    return UInt(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt.");
}